

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::GenericTrack::Copy(GenericTrack *this,GenericTrack *rhs)

{
  GenericTrack *rhs_local;
  GenericTrack *this_local;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  this->TrackID = rhs->TrackID;
  this->TrackNumber = rhs->TrackNumber;
  optional_property<ASDCP::MXF::UTF16String>::operator=(&this->TrackName,&rhs->TrackName);
  optional_property<Kumu::UUID>::operator=(&this->Sequence,&rhs->Sequence);
  return;
}

Assistant:

void
GenericTrack::Copy(const GenericTrack& rhs)
{
  InterchangeObject::Copy(rhs);
  TrackID = rhs.TrackID;
  TrackNumber = rhs.TrackNumber;
  TrackName = rhs.TrackName;
  Sequence = rhs.Sequence;
}